

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

int lj_lib_checkopt(lua_State *L,int narg,int def,char *lst)

{
  int iVar1;
  byte *in_RCX;
  int in_EDX;
  uint in_ESI;
  lua_State *in_RDI;
  int i;
  MSize len;
  char *opt;
  GCstr *s;
  GCstr *local_40;
  int local_38;
  int in_stack_ffffffffffffffcc;
  MSize MVar2;
  lua_State *in_stack_ffffffffffffffd0;
  GCstr *__s1;
  byte *local_20;
  int local_4;
  
  if (in_EDX < 0) {
    local_40 = lj_lib_checkstr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  else {
    local_40 = lj_lib_optstr(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  }
  local_4 = in_EDX;
  if (local_40 != (GCstr *)0x0) {
    __s1 = local_40 + 1;
    MVar2 = local_40->len;
    local_38 = 0;
    local_20 = in_RCX;
    while( true ) {
      if (*local_20 == 0) {
        lj_err_argv(in_RDI,(int)(ulong)in_ESI,LJ_ERR_INVOPTM,__s1);
      }
      if ((*local_20 == MVar2) && (iVar1 = memcmp(__s1,local_20 + 1,(ulong)MVar2), iVar1 == 0))
      break;
      local_20 = local_20 + (int)(*local_20 + 1);
      local_38 = local_38 + 1;
    }
    local_4 = local_38;
  }
  return local_4;
}

Assistant:

int lj_lib_checkopt(lua_State *L, int narg, int def, const char *lst)
{
  GCstr *s = def >= 0 ? lj_lib_optstr(L, narg) : lj_lib_checkstr(L, narg);
  if (s) {
    const char *opt = strdata(s);
    MSize len = s->len;
    int i;
    for (i = 0; *(const uint8_t *)lst; i++) {
      if (*(const uint8_t *)lst == len && memcmp(opt, lst+1, len) == 0)
	return i;
      lst += 1+*(const uint8_t *)lst;
    }
    lj_err_argv(L, narg, LJ_ERR_INVOPTM, opt);
  }
  return def;
}